

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O1

void __thiscall
TEST_MockParameterTest_expectOneMemBufferParameterAndValue_Test::testBody
          (TEST_MockParameterTest_expectOneMemBufferParameterAndValue_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uchar memBuffer2 [3];
  uchar memBuffer1 [3];
  undefined2 local_40;
  undefined1 local_3e;
  undefined2 local_3c;
  undefined1 local_3a;
  SimpleString local_38;
  SimpleString local_28;
  SimpleString local_18;
  
  local_3a = 0xff;
  local_3c = 0x1512;
  local_3e = 0xff;
  local_40 = 0x1512;
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_18,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_18);
  SimpleString::SimpleString(&local_28,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xb8))
            ((long *)CONCAT44(extraout_var,iVar1),&local_28,&local_3c,3);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_18,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_18);
  SimpleString::SimpleString(&local_28,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x98))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_28,&local_40,3);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_38);
  return;
}

Assistant:

TEST(MockParameterTest, expectOneMemBufferParameterAndValue)
{
    unsigned char memBuffer1[] = { 0x12, 0x15, 0xFF };
    unsigned char memBuffer2[] = { 0x12, 0x15, 0xFF };
    mock().expectOneCall("foo").withParameter("parameter", memBuffer1, sizeof(memBuffer1));
    mock().actualCall("foo").withParameter("parameter", memBuffer2, sizeof(memBuffer2));

    mock().checkExpectations();
}